

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to8.h
# Opt level: O2

void ncnn::im2col_sgemm_pack1to8_avx
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  uint _h;
  size_t sVar6;
  size_t sVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  int *piVar17;
  _func_int ***ppp_Var18;
  uint _c;
  ulong uVar19;
  ulong uVar20;
  undefined1 (*pauVar21) [32];
  undefined1 (*pauVar22) [32];
  long lVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  undefined4 *puVar28;
  byte bVar29;
  ulong uVar30;
  float *pfVar31;
  long lVar32;
  undefined1 (*pauVar33) [16];
  int q;
  int iVar34;
  ulong uVar35;
  long lVar36;
  undefined4 *puVar37;
  ulong uVar38;
  bool bVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 local_d8 [64];
  size_t local_98;
  ulong local_88;
  ulong local_80;
  Mat *local_78;
  long local_70;
  Allocator *local_68;
  void *local_60;
  float zeros [8];
  
  uVar5 = bottom_im2col->w;
  uVar38 = (ulong)(int)uVar5;
  uVar25 = bottom_im2col->h;
  local_88 = (ulong)uVar25;
  _h = bottom_im2col->c;
  local_80 = (ulong)(uint)top_blob->c;
  local_60 = _bias->data;
  local_98 = 0;
  local_d8._0_8_ = (Allocator *)0x0;
  local_d8._8_4_ = 0;
  local_d8._12_4_ = 0;
  local_d8._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_d8._24_4_ = 0;
  local_d8._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  if ((long)uVar38 < 8) {
    _c = uVar5;
    if (3 < (int)uVar5) {
      uVar25 = uVar25 * 4;
      _c = (uVar5 & 3) + 1;
    }
  }
  else {
    uVar25 = uVar25 * 8;
    _c = (uVar5 & 3) + (uVar5 >> 3) + (uint)((uVar5 >> 2 & 1) != 0);
  }
  local_d8._32_8_ = local_d8._0_8_;
  local_d8._40_4_ = local_d8._8_4_;
  local_d8._44_4_ = local_d8._12_4_;
  local_78 = top_blob;
  Mat::create((Mat *)local_d8,uVar25,_h,_c,4,1,opt->workspace_allocator);
  uVar19 = 0;
  iVar26 = (int)local_88;
  iVar34 = 0;
  if (0 < iVar26) {
    iVar34 = iVar26;
  }
  uVar30 = 0;
  if (0 < (int)_h) {
    uVar30 = (ulong)_h;
  }
  uVar20 = (ulong)(uint)((int)uVar5 >> 3);
  if ((int)uVar5 >> 3 < 1) {
    uVar20 = uVar19;
  }
  for (uVar27 = 0; uVar27 != uVar20; uVar27 = uVar27 + 1) {
    ppp_Var18 = (_func_int ***)
                ((long)(_func_int ***)local_d8._0_8_ + local_98 * uVar27 * local_d8._16_8_);
    for (uVar35 = 0; uVar35 != uVar30; uVar35 = uVar35 + 1) {
      pauVar22 = (undefined1 (*) [32])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar35 + uVar19);
      iVar24 = iVar34;
      while (bVar39 = iVar24 != 0, iVar24 = iVar24 + -1, bVar39) {
        *(undefined1 (*) [32])ppp_Var18 = *pauVar22;
        ppp_Var18 = ppp_Var18 + 4;
        pauVar22 = (undefined1 (*) [32])(*pauVar22 + uVar38 * 4);
      }
    }
    uVar19 = uVar19 + 0x20;
  }
  uVar25 = uVar5 >> 2 & 1;
  lVar36 = (uVar38 & 0xfffffffffffffff8) << 2;
  for (uVar19 = 0; iVar24 = (int)(uVar38 & 0xfffffffffffffff8), uVar19 != uVar25;
      uVar19 = uVar19 + 1) {
    iVar24 = iVar24 + (int)uVar19 * 4;
    ppp_Var18 = (_func_int ***)
                ((long)(_func_int ***)local_d8._0_8_ +
                (long)((iVar24 % 8 >> 2) + iVar24 / 8) * local_98 * local_d8._16_8_);
    for (uVar20 = 0; uVar20 != uVar30; uVar20 = uVar20 + 1) {
      pauVar33 = (undefined1 (*) [16])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar20 + lVar36);
      iVar24 = iVar34;
      while (bVar39 = iVar24 != 0, iVar24 = iVar24 + -1, bVar39) {
        *(undefined1 (*) [16])ppp_Var18 = *pauVar33;
        ppp_Var18 = ppp_Var18 + 2;
        pauVar33 = (undefined1 (*) [16])(*pauVar33 + uVar38 * 4);
      }
    }
    lVar36 = lVar36 + 0x10;
  }
  local_68 = (Allocator *)local_d8._0_8_;
  local_70 = local_98 * local_d8._16_8_;
  uVar19 = (ulong)(int)(iVar24 + uVar25 * 4);
  lVar36 = uVar19 * 4;
  for (; (long)uVar19 < (long)uVar38; uVar19 = uVar19 + 1) {
    uVar25 = (int)uVar19 >> 0x1f;
    uVar20 = (ulong)uVar25 << 0x20 | uVar19 & 0xffffffff;
    sVar6 = bottom_im2col->cstep;
    sVar7 = bottom_im2col->elemsize;
    ppp_Var18 = (_func_int ***)
                ((long)(_func_int ***)local_d8._0_8_ +
                ((int)((long)((ulong)uVar25 << 0x20 | uVar19 & 0xffffffff) % 4) +
                 (int)((long)uVar20 / 8) + (int)(char)((char)((long)uVar20 % 8) / '\x04')) *
                local_70);
    puVar37 = (undefined4 *)((long)bottom_im2col->data + lVar36);
    for (uVar20 = 0; puVar28 = puVar37, iVar24 = iVar34, uVar20 != uVar30; uVar20 = uVar20 + 1) {
      while (iVar24 != 0) {
        *(undefined4 *)ppp_Var18 = *puVar28;
        ppp_Var18 = (_func_int ***)((long)ppp_Var18 + 4);
        puVar28 = puVar28 + uVar38;
        iVar24 = iVar24 + -1;
      }
      puVar37 = (undefined4 *)((long)puVar37 + sVar6 * sVar7);
    }
    lVar36 = lVar36 + 4;
  }
  uVar30 = 0;
  uVar19 = (ulong)(_h * iVar26);
  if ((int)(_h * iVar26) < 1) {
    uVar19 = uVar30;
  }
  uVar20 = local_80 & 0xffffffff;
  if ((int)local_80 < 1) {
    uVar20 = uVar30;
  }
  for (; uVar30 != uVar20; uVar30 = uVar30 + 1) {
    pauVar21 = (undefined1 (*) [32])
               (local_78->cstep * uVar30 * local_78->elemsize + (long)local_78->data);
    zeros[0] = 0.0;
    zeros[1] = 0.0;
    zeros[2] = 0.0;
    zeros[3] = 0.0;
    zeros[4] = 0.0;
    zeros[5] = 0.0;
    zeros[6] = 0.0;
    zeros[7] = 0.0;
    pauVar22 = (undefined1 (*) [32])(uVar30 * 0x20 + (long)local_60);
    if (local_60 == (void *)0x0) {
      pauVar22 = (undefined1 (*) [32])zeros;
    }
    lVar36 = 0;
    for (uVar27 = 0; (long)(uVar27 | 7) < (long)uVar38; uVar27 = uVar27 + 8) {
      lVar32 = local_98 * local_d8._16_8_ * lVar36;
      auVar40 = *pauVar22;
      lVar23 = 0;
      uVar35 = uVar19;
      auVar43 = auVar40;
      auVar8 = auVar40;
      auVar9 = auVar40;
      auVar42 = auVar40;
      auVar45 = auVar40;
      auVar47 = auVar40;
      auVar49 = auVar40;
      while (iVar34 = (int)uVar35, uVar35 = (ulong)(iVar34 - 1), iVar34 != 0) {
        fVar1 = *(float *)((long)(_func_int ***)local_d8._0_8_ + lVar23 + lVar32);
        pfVar31 = (float *)((long)kernel->data + lVar23 + kernel->cstep * uVar30 * kernel->elemsize)
        ;
        fVar4 = *pfVar31;
        fVar10 = pfVar31[1];
        fVar11 = pfVar31[2];
        fVar12 = pfVar31[3];
        fVar13 = pfVar31[4];
        fVar14 = pfVar31[5];
        fVar15 = pfVar31[6];
        fVar2 = *(float *)((long)(_func_int ***)local_d8._0_8_ + lVar23 + lVar32 + 4);
        auVar41._0_4_ = fVar1 * fVar4 + auVar40._0_4_;
        auVar41._4_4_ = fVar1 * fVar10 + auVar40._4_4_;
        auVar41._8_4_ = fVar1 * fVar11 + auVar40._8_4_;
        auVar41._12_4_ = fVar1 * fVar12 + auVar40._12_4_;
        auVar41._16_4_ = fVar1 * fVar13 + auVar40._16_4_;
        auVar41._20_4_ = fVar1 * fVar14 + auVar40._20_4_;
        auVar41._24_4_ = fVar1 * fVar15 + auVar40._24_4_;
        auVar41._28_4_ = fVar1 + auVar40._28_4_;
        fVar3 = *(float *)((long)&((Allocator *)(local_d8._0_8_ + 8))->_vptr_Allocator +
                          lVar23 + lVar32);
        auVar44._0_4_ = fVar2 * fVar4 + auVar43._0_4_;
        auVar44._4_4_ = fVar2 * fVar10 + auVar43._4_4_;
        auVar44._8_4_ = fVar2 * fVar11 + auVar43._8_4_;
        auVar44._12_4_ = fVar2 * fVar12 + auVar43._12_4_;
        auVar44._16_4_ = fVar2 * fVar13 + auVar43._16_4_;
        auVar44._20_4_ = fVar2 * fVar14 + auVar43._20_4_;
        auVar44._24_4_ = fVar2 * fVar15 + auVar43._24_4_;
        auVar44._28_4_ = fVar1 + auVar43._28_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_d8._0_8_ + 8))->_vptr_Allocator +
                          lVar23 + lVar32 + 4);
        auVar46._0_4_ = fVar3 * fVar4 + auVar8._0_4_;
        auVar46._4_4_ = fVar3 * fVar10 + auVar8._4_4_;
        auVar46._8_4_ = fVar3 * fVar11 + auVar8._8_4_;
        auVar46._12_4_ = fVar3 * fVar12 + auVar8._12_4_;
        auVar46._16_4_ = fVar3 * fVar13 + auVar8._16_4_;
        auVar46._20_4_ = fVar3 * fVar14 + auVar8._20_4_;
        auVar46._24_4_ = fVar3 * fVar15 + auVar8._24_4_;
        auVar46._28_4_ = fVar3 + auVar8._28_4_;
        fVar2 = *(float *)((long)&((Allocator *)(local_d8._0_8_ + 0x10))->_vptr_Allocator +
                          lVar23 + lVar32);
        auVar48._0_4_ = fVar1 * fVar4 + auVar9._0_4_;
        auVar48._4_4_ = fVar1 * fVar10 + auVar9._4_4_;
        auVar48._8_4_ = fVar1 * fVar11 + auVar9._8_4_;
        auVar48._12_4_ = fVar1 * fVar12 + auVar9._12_4_;
        auVar48._16_4_ = fVar1 * fVar13 + auVar9._16_4_;
        auVar48._20_4_ = fVar1 * fVar14 + auVar9._20_4_;
        auVar48._24_4_ = fVar1 * fVar15 + auVar9._24_4_;
        auVar48._28_4_ = fVar1 + auVar9._28_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_d8._0_8_ + 0x10))->_vptr_Allocator +
                          lVar23 + lVar32 + 4);
        auVar50._0_4_ = fVar2 * fVar4 + auVar42._0_4_;
        auVar50._4_4_ = fVar2 * fVar10 + auVar42._4_4_;
        auVar50._8_4_ = fVar2 * fVar11 + auVar42._8_4_;
        auVar50._12_4_ = fVar2 * fVar12 + auVar42._12_4_;
        auVar50._16_4_ = fVar2 * fVar13 + auVar42._16_4_;
        auVar50._20_4_ = fVar2 * fVar14 + auVar42._20_4_;
        auVar50._24_4_ = fVar2 * fVar15 + auVar42._24_4_;
        auVar50._28_4_ = fVar2 + auVar42._28_4_;
        fVar2 = *(float *)((long)&((Allocator *)(local_d8._0_8_ + 0x18))->_vptr_Allocator +
                          lVar23 + lVar32);
        auVar51._0_4_ = fVar1 * fVar4 + auVar45._0_4_;
        auVar51._4_4_ = fVar1 * fVar10 + auVar45._4_4_;
        auVar51._8_4_ = fVar1 * fVar11 + auVar45._8_4_;
        auVar51._12_4_ = fVar1 * fVar12 + auVar45._12_4_;
        auVar51._16_4_ = fVar1 * fVar13 + auVar45._16_4_;
        auVar51._20_4_ = fVar1 * fVar14 + auVar45._20_4_;
        auVar51._24_4_ = fVar1 * fVar15 + auVar45._24_4_;
        auVar51._28_4_ = fVar1 + auVar45._28_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_d8._0_8_ + 0x18))->_vptr_Allocator +
                          lVar23 + lVar32 + 4);
        auVar52._0_4_ = fVar2 * fVar4 + auVar47._0_4_;
        auVar52._4_4_ = fVar2 * fVar10 + auVar47._4_4_;
        auVar52._8_4_ = fVar2 * fVar11 + auVar47._8_4_;
        auVar52._12_4_ = fVar2 * fVar12 + auVar47._12_4_;
        auVar52._16_4_ = fVar2 * fVar13 + auVar47._16_4_;
        auVar52._20_4_ = fVar2 * fVar14 + auVar47._20_4_;
        auVar52._24_4_ = fVar2 * fVar15 + auVar47._24_4_;
        auVar52._28_4_ = fVar2 + auVar47._28_4_;
        auVar53._0_4_ = fVar1 * fVar4 + auVar49._0_4_;
        auVar53._4_4_ = fVar1 * fVar10 + auVar49._4_4_;
        auVar53._8_4_ = fVar1 * fVar11 + auVar49._8_4_;
        auVar53._12_4_ = fVar1 * fVar12 + auVar49._12_4_;
        auVar53._16_4_ = fVar1 * fVar13 + auVar49._16_4_;
        auVar53._20_4_ = fVar1 * fVar14 + auVar49._20_4_;
        auVar53._24_4_ = fVar1 * fVar15 + auVar49._24_4_;
        auVar53._28_4_ = fVar1 + auVar49._28_4_;
        lVar23 = lVar23 + 0x20;
        auVar40 = auVar41;
        auVar43 = auVar44;
        auVar8 = auVar46;
        auVar9 = auVar48;
        auVar42 = auVar50;
        auVar45 = auVar51;
        auVar47 = auVar52;
        auVar49 = auVar53;
      }
      *pauVar21 = auVar40;
      pauVar21[1] = auVar43;
      pauVar21[2] = auVar8;
      pauVar21[3] = auVar9;
      pauVar21[4] = auVar42;
      pauVar21[5] = auVar45;
      pauVar21[6] = auVar47;
      pauVar21[7] = auVar49;
      pauVar21 = pauVar21 + 8;
      lVar36 = lVar36 + 1;
    }
    bVar29 = 0;
    for (; (int)((uint)uVar27 | 3) < (int)uVar5; uVar27 = (ulong)((uint)uVar27 + 4)) {
      lVar23 = local_98 * local_d8._16_8_ *
               (ulong)((bVar29 & 1) + ((uint)(uVar27 >> 3) & 0x1fffffff));
      auVar40 = *pauVar22;
      lVar36 = 0;
      uVar35 = uVar19;
      auVar43 = auVar40;
      auVar8 = auVar40;
      auVar9 = auVar40;
      while (iVar34 = (int)uVar35, uVar35 = (ulong)(iVar34 - 1), iVar34 != 0) {
        fVar1 = *(float *)((long)(_func_int ***)local_d8._0_8_ + lVar36 + lVar23);
        fVar2 = *(float *)((long)(_func_int ***)local_d8._0_8_ + lVar36 + lVar23 + 4);
        fVar3 = *(float *)((long)&((Allocator *)(local_d8._0_8_ + 8))->_vptr_Allocator +
                          lVar36 + lVar23);
        pfVar31 = (float *)((long)kernel->data +
                           lVar36 * 2 + kernel->cstep * uVar30 * kernel->elemsize);
        fVar10 = *pfVar31;
        fVar11 = pfVar31[1];
        fVar12 = pfVar31[2];
        fVar13 = pfVar31[3];
        fVar14 = pfVar31[4];
        fVar15 = pfVar31[5];
        fVar16 = pfVar31[6];
        fVar4 = *(float *)((long)&((Allocator *)(local_d8._0_8_ + 8))->_vptr_Allocator +
                          lVar36 + lVar23 + 4);
        auVar42._0_4_ = fVar10 * fVar1 + auVar40._0_4_;
        auVar42._4_4_ = fVar11 * fVar1 + auVar40._4_4_;
        auVar42._8_4_ = fVar12 * fVar1 + auVar40._8_4_;
        auVar42._12_4_ = fVar13 * fVar1 + auVar40._12_4_;
        auVar42._16_4_ = fVar14 * fVar1 + auVar40._16_4_;
        auVar42._20_4_ = fVar15 * fVar1 + auVar40._20_4_;
        auVar42._24_4_ = fVar16 * fVar1 + auVar40._24_4_;
        auVar42._28_4_ = fVar1 + auVar40._28_4_;
        auVar45._0_4_ = fVar10 * fVar2 + auVar43._0_4_;
        auVar45._4_4_ = fVar11 * fVar2 + auVar43._4_4_;
        auVar45._8_4_ = fVar12 * fVar2 + auVar43._8_4_;
        auVar45._12_4_ = fVar13 * fVar2 + auVar43._12_4_;
        auVar45._16_4_ = fVar14 * fVar2 + auVar43._16_4_;
        auVar45._20_4_ = fVar15 * fVar2 + auVar43._20_4_;
        auVar45._24_4_ = fVar16 * fVar2 + auVar43._24_4_;
        auVar45._28_4_ = fVar1 + auVar43._28_4_;
        auVar47._0_4_ = fVar10 * fVar3 + auVar8._0_4_;
        auVar47._4_4_ = fVar11 * fVar3 + auVar8._4_4_;
        auVar47._8_4_ = fVar12 * fVar3 + auVar8._8_4_;
        auVar47._12_4_ = fVar13 * fVar3 + auVar8._12_4_;
        auVar47._16_4_ = fVar14 * fVar3 + auVar8._16_4_;
        auVar47._20_4_ = fVar15 * fVar3 + auVar8._20_4_;
        auVar47._24_4_ = fVar16 * fVar3 + auVar8._24_4_;
        auVar47._28_4_ = fVar1 + auVar8._28_4_;
        auVar49._0_4_ = fVar4 * fVar10 + auVar9._0_4_;
        auVar49._4_4_ = fVar4 * fVar11 + auVar9._4_4_;
        auVar49._8_4_ = fVar4 * fVar12 + auVar9._8_4_;
        auVar49._12_4_ = fVar4 * fVar13 + auVar9._12_4_;
        auVar49._16_4_ = fVar4 * fVar14 + auVar9._16_4_;
        auVar49._20_4_ = fVar4 * fVar15 + auVar9._20_4_;
        auVar49._24_4_ = fVar4 * fVar16 + auVar9._24_4_;
        auVar49._28_4_ = fVar1 + auVar9._28_4_;
        lVar36 = lVar36 + 0x10;
        auVar40 = auVar42;
        auVar43 = auVar45;
        auVar8 = auVar47;
        auVar9 = auVar49;
      }
      *pauVar21 = auVar40;
      pauVar21[1] = auVar43;
      pauVar21[2] = auVar8;
      pauVar21[3] = auVar9;
      pauVar21 = pauVar21 + 4;
      bVar29 = bVar29 + 1;
    }
    while( true ) {
      uVar25 = (uint)uVar27;
      if ((int)uVar5 <= (int)uVar25) break;
      pfVar31 = (float *)(kernel->cstep * uVar30 * kernel->elemsize + (long)kernel->data);
      auVar40 = *pauVar22;
      for (lVar36 = 0; (int)uVar19 != (int)lVar36; lVar36 = lVar36 + 1) {
        fVar1 = *(float *)((long)(_func_int ***)local_d8._0_8_ +
                          lVar36 * 4 +
                          local_98 * local_d8._16_8_ *
                          (ulong)((uVar25 & 3) + ((uint)(uVar27 >> 3) & 0x1fffffff) +
                                 (uint)((uVar25 >> 2 & 1) != 0)));
        auVar43._0_4_ = fVar1 * *pfVar31 + auVar40._0_4_;
        auVar43._4_4_ = fVar1 * pfVar31[1] + auVar40._4_4_;
        auVar43._8_4_ = fVar1 * pfVar31[2] + auVar40._8_4_;
        auVar43._12_4_ = fVar1 * pfVar31[3] + auVar40._12_4_;
        auVar43._16_4_ = fVar1 * pfVar31[4] + auVar40._16_4_;
        auVar43._20_4_ = fVar1 * pfVar31[5] + auVar40._20_4_;
        auVar43._24_4_ = fVar1 * pfVar31[6] + auVar40._24_4_;
        auVar43._28_4_ = fVar1 + auVar40._28_4_;
        pfVar31 = pfVar31 + 8;
        auVar40 = auVar43;
      }
      *pauVar21 = auVar40;
      pauVar21 = pauVar21 + 1;
      uVar27 = (ulong)(uVar25 + 1);
    }
  }
  piVar17 = (int *)CONCAT44(local_d8._12_4_,local_d8._8_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if ((Allocator *)local_d8._32_8_ == (Allocator *)0x0) {
        free((void *)local_d8._0_8_);
      }
      else {
        (*(*(_func_int ***)local_d8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack1to8_avx(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 4u, 1, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 4u, 1, opt.workspace_allocator);
    {
        int nn_size = size >> 3;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256 _r0 = _mm256_loadu_ps(img0);
                    _mm256_store_ps(tmpptr, _r0);

                    img0 += size;
                    tmpptr += 8;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _r0 = _mm_loadu_ps(img0);
                    _mm_store_ps(tmpptr, _r0);

                    img0 += size;
                    tmpptr += 4;
                }
            }
        }

        remain_size_start += nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    img0 += size;
                    tmpptr += 1;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[8] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 8 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 8);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;
            __m256 _sum4 = _sum0;
            __m256 _sum5 = _sum0;
            __m256 _sum6 = _sum0;
            __m256 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr0);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);
                _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);
                __m256 _val4 = _mm256_broadcast_ss(tmpptr + 4);
                __m256 _val5 = _mm256_broadcast_ss(tmpptr + 5);
                _sum4 = _mm256_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm256_comp_fmadd_ps(_val5, _w0, _sum5);
                __m256 _val6 = _mm256_broadcast_ss(tmpptr + 6);
                __m256 _val7 = _mm256_broadcast_ss(tmpptr + 7);
                _sum6 = _mm256_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm256_comp_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr0 += 8;
            }

            _mm256_store_ps(outptr0, _sum0);
            _mm256_store_ps(outptr0 + 8, _sum1);
            _mm256_store_ps(outptr0 + 8 * 2, _sum2);
            _mm256_store_ps(outptr0 + 8 * 3, _sum3);
            _mm256_store_ps(outptr0 + 8 * 4, _sum4);
            _mm256_store_ps(outptr0 + 8 * 5, _sum5);
            _mm256_store_ps(outptr0 + 8 * 6, _sum6);
            _mm256_store_ps(outptr0 + 8 * 7, _sum7);
            outptr0 += 64;
        }
        for (; i + 3 < size; i += 4)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr0);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);

                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr0 += 8;
            }

            _mm256_store_ps(outptr0, _sum0);
            _mm256_store_ps(outptr0 + 8, _sum1);
            _mm256_store_ps(outptr0 + 16, _sum2);
            _mm256_store_ps(outptr0 + 24, _sum3);
            outptr0 += 32;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m256 _sum = _mm256_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr0);
                __m256 _val = _mm256_broadcast_ss(tmpptr);
                _sum = _mm256_comp_fmadd_ps(_w0, _val, _sum);

                tmpptr += 1;
                kptr0 += 8;
            }

            _mm256_store_ps(outptr0, _sum);
            outptr0 += 8;
        }
    }
}